

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Inequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int aiVar1 [2];
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int aiVar6 [2];
  DdNode *g;
  DdNode *h;
  byte bVar7;
  int local_d0;
  int local_cc;
  int newIndex [2];
  DdNode *newMap [2];
  int iStack_b0;
  int j;
  DdNode *fminus;
  DdNode *fequal;
  DdNode *fplus;
  DdNode *g1;
  DdNode *g0;
  int rightChild;
  int middleChild;
  int leftChild;
  int kFalseLower;
  int kTrueLower;
  int index [2];
  int invalidIndex;
  DdNode *map [2];
  DdNode *zero;
  DdNode *one;
  DdNode *f;
  int i;
  int mask;
  int kFalse;
  int kTrue;
  DdNode **y_local;
  DdNode **x_local;
  int c_local;
  int N_local;
  DdManager *dd_local;
  
  f._4_4_ = 1;
  one = (DdNode *)0x0;
  aiVar1 = (int  [2])dd->one;
  aiVar6 = (int  [2])((ulong)aiVar1 ^ 1);
  memset(index + 1,0,0x10);
  bVar2 = (byte)N;
  kFalseLower = 1 << (bVar2 - 1 & 0x1f);
  if (N < 0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    dd_local = (DdManager *)aiVar6;
    if (N == 0) {
      if (-1 < c) {
        dd_local = (DdManager *)aiVar1;
      }
    }
    else if ((c <= (1 << (bVar2 & 0x1f)) + -1) &&
            (dd_local = (DdManager *)aiVar1, 1 - (1 << (bVar2 & 0x1f)) < c)) {
      kTrueLower = kFalseLower;
      index[0] = kFalseLower;
      i = c + -1;
      mask = c;
      for (f._0_4_ = 1; (int)f <= N; f._0_4_ = (int)f + 1) {
        memset(newIndex,0,0x10);
        bVar7 = (byte)(int)f;
        iVar3 = (c + -1 >> (bVar7 & 0x1f)) + (uint)((c & f._4_4_) != 1) + 1;
        f._4_4_ = f._4_4_ << 1 | 1;
        newMap[1]._4_4_ = c >> (bVar7 & 0x1f);
        iVar4 = newMap[1]._4_4_ + -1;
        local_d0 = index[0];
        local_cc = index[0];
        for (; newMap[1]._4_4_ < iVar3; newMap[1]._4_4_ = newMap[1]._4_4_ + 1) {
          if ((newMap[1]._4_4_ < 1 << (bVar2 - bVar7 & 0x1f)) &&
             (-(1 << (bVar2 - bVar7 & 0x1f)) < newMap[1]._4_4_)) {
            iVar5 = newMap[1]._4_4_ * 2 + -1;
            _iStack_b0 = aiVar1;
            if ((iVar5 < mask) && (_iStack_b0 = aiVar6, i < iVar5)) {
              if ((iVar5 != kFalseLower) && (iVar5 != kTrueLower)) {
                __assert_fail("leftChild == index[0] || leftChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x331,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kFalseLower) {
                iStack_b0 = index[1];
                j = invalidIndex;
              }
              else {
                _iStack_b0 = (int  [2])map[0];
              }
            }
            iVar5 = newMap[1]._4_4_ << 1;
            fminus = (DdNode *)aiVar1;
            if ((iVar5 < mask) && (fminus = (DdNode *)aiVar6, i < iVar5)) {
              if ((iVar5 != kFalseLower) && (iVar5 != kTrueLower)) {
                __assert_fail("middleChild == index[0] || middleChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x340,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kFalseLower) {
                fminus = (DdNode *)stack0xffffffffffffff98;
              }
              else {
                fminus = map[0];
              }
            }
            iVar5 = newMap[1]._4_4_ * 2 + 1;
            fequal = (DdNode *)aiVar1;
            if ((iVar5 < mask) && (fequal = (DdNode *)aiVar6, i < iVar5)) {
              if ((iVar5 != kFalseLower) && (iVar5 != kTrueLower)) {
                __assert_fail("rightChild == index[0] || rightChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x34f,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              if (iVar5 == kFalseLower) {
                fequal = (DdNode *)stack0xffffffffffffff98;
              }
              else {
                fequal = map[0];
              }
            }
            g = Cudd_bddIte(dd,y[N - (int)f],fminus,fequal);
            if (g == (DdNode *)0x0) {
              if (kFalseLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff98);
              }
              if (kTrueLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_d0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_cc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
            h = Cudd_bddIte(dd,y[N - (int)f],(DdNode *)_iStack_b0,fminus);
            if (h == (DdNode *)0x0) {
              Cudd_IterDerefBdd(dd,g);
              if (kFalseLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff98);
              }
              if (kTrueLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_d0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_cc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
            one = Cudd_bddIte(dd,x[N - (int)f],g,h);
            if ((int  [2])one == (int  [2])0x0) {
              Cudd_IterDerefBdd(dd,g);
              Cudd_IterDerefBdd(dd,h);
              if (kFalseLower != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff98);
              }
              if (kTrueLower != index[0]) {
                Cudd_IterDerefBdd(dd,map[0]);
              }
              if (local_d0 != index[0]) {
                Cudd_IterDerefBdd(dd,(DdNode *)newIndex);
              }
              if (local_cc != index[0]) {
                Cudd_IterDerefBdd(dd,newMap[0]);
              }
              return (DdNode *)0x0;
            }
            *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + 1;
            Cudd_IterDerefBdd(dd,g);
            Cudd_IterDerefBdd(dd,h);
            if ((local_d0 != index[0]) && (local_cc != index[0])) {
              __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                            ,0x37a,
                            "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)");
            }
            if (local_d0 == index[0]) {
              local_d0 = newMap[1]._4_4_;
              newIndex = (int  [2])one;
            }
            else {
              local_cc = newMap[1]._4_4_;
              newMap[0] = one;
            }
          }
        }
        if (kFalseLower != index[0]) {
          Cudd_IterDerefBdd(dd,(DdNode *)stack0xffffffffffffff98);
        }
        if (kTrueLower != index[0]) {
          Cudd_IterDerefBdd(dd,map[0]);
        }
        index[1] = newIndex[0];
        invalidIndex = newIndex[1];
        map[0] = newMap[0];
        kFalseLower = local_d0;
        kTrueLower = local_cc;
        i = iVar4;
        mask = iVar3;
      }
      *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)one & 0xfffffffffffffffe) + 4) + -1;
      dd_local = (DdManager *)one;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Inequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrue = c;
    int kFalse = c - 1;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c >= 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c) return(zero);
    else if ((-(1 << N) + 1) >= c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLower, kFalseLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLower = kTrue;
        kFalseLower = kFalse;
        /* kTrue = ceiling((c-1)/2^i) + 1 */
        kTrue = ((c-1) >> i) + ((c & mask) != 1) + 1;
        mask = (mask << 1) | 1;
        /* kFalse = floor(c/2^i) - 1 */
        kFalse = (c >> i) - 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kFalse + 1; j < kTrue; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLower) {
                fminus = one;
            } else if (leftChild <= kFalseLower) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLower) {
                fequal = one;
            } else if (middleChild <= kFalseLower) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLower) {
                fplus = one;
            } else if (rightChild <= kFalseLower) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}